

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O3

w_status wp_token_scan_flt_exponent(w_tokenizer *tokenizer,w_token_id *id,w_token_id id_on_success)

{
  byte bVar1;
  byte *pbVar2;
  w_status wVar3;
  char *pcVar4;
  
  if (tokenizer == (w_tokenizer *)0x0) {
    w_handle_failed_assertion
              ("tokenizer != NULL","wp_token_scan_flt_exponent",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x185);
  }
  pcVar4 = tokenizer->it;
  if (pcVar4 == (char *)0x0) {
    w_handle_failed_assertion
              ("tokenizer->it != NULL","wp_token_scan_flt_exponent",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x186);
    pcVar4 = tokenizer->it;
  }
  if ((pcVar4[-1] != 'e') && (pcVar4[-1] != 'p')) {
    w_handle_failed_assertion
              ("tokenizer->it[-1] == \'e\' || tokenizer->it[-1] == \'p\'",
               "wp_token_scan_flt_exponent",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x187);
  }
  if (id == (w_token_id *)0x0) {
    w_handle_failed_assertion
              ("id != NULL","wp_token_scan_flt_exponent",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/lang/token.c"
               ,0x188);
  }
  pbVar2 = (byte *)tokenizer->it;
  bVar1 = *pbVar2;
  if ((bVar1 == 0x2d) || (bVar1 == 0x2b)) {
    tokenizer->it = (char *)(pbVar2 + 1);
    tokenizer->column = tokenizer->column + 1;
    bVar1 = pbVar2[1];
  }
  if (bVar1 < 0x3a) {
    if ((0x3ff000000000000U >> ((ulong)bVar1 & 0x3f) & 1) == 0) {
      if ((0xac0100000401U >> ((ulong)bVar1 & 0x3f) & 1) != 0) {
        pcVar4 = "unterminated floating-point exponent";
        goto LAB_00107cc1;
      }
    }
    else {
      wp_token_consume_decimal_digits(tokenizer);
      if (((ulong)(byte)*tokenizer->it < 0x30) &&
         ((0xac0100000401U >> ((ulong)(byte)*tokenizer->it & 0x3f) & 1) != 0)) {
        *id = id_on_success;
        return W_SUCCESS;
      }
    }
  }
  pcVar4 = "not a valid floating-point exponent character";
LAB_00107cc1:
  wVar3 = wp_token_add_error(tokenizer,pcVar4);
  return wVar3;
}

Assistant:

static enum w_status
wp_token_scan_flt_exponent(
    struct w_tokenizer *tokenizer,
    enum w_token_id *id,
    enum w_token_id id_on_success
)
{
    W_ASSERT(tokenizer != NULL);
    W_ASSERT(tokenizer->it != NULL);
    W_ASSERT(tokenizer->it[-1] == 'e' || tokenizer->it[-1] == 'p');
    W_ASSERT(id != NULL);

    if (*tokenizer->it == '+' || *tokenizer->it == '-')
    {
        wp_token_advance_iter(tokenizer);
    }

    switch (*tokenizer->it)
    {
        case WP_TOKEN_CASE_DECIMAL_DIGITS:
        {
            wp_token_consume_decimal_digits(tokenizer);
            switch (*tokenizer->it)
            {
                case WP_TOKEN_CASE_VALID_FOLLOW_UP_TO_NUMBER_LITERAL:
                {
                    *id = id_on_success;
                    return W_SUCCESS;
                }
                default:
                {
                    return wp_token_add_error(
                        tokenizer,
                        WP_TOKEN_GET_ERROR_MSG_INVALID_CHAR(
                            "floating-point exponent"
                        )
                    );
                }
            }
        }
        case WP_TOKEN_CASE_VALID_FOLLOW_UP_TO_NUMBER_LITERAL:
        {
            return wp_token_add_error(
                tokenizer,
                WP_TOKEN_GET_ERROR_MSG_UNTERMINATED("floating-point exponent")
            );
        }
        default:
        {
            return wp_token_add_error(
                tokenizer,
                WP_TOKEN_GET_ERROR_MSG_INVALID_CHAR("floating-point exponent")
            );
        }
    }
}